

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax
          (ExternUdpDeclSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token externKeyword,SyntaxList<slang::syntax::AttributeInstanceSyntax> *actualAttributes,
          Token primitive,Token name,UdpPortListSyntax *portList)

{
  bool bVar1;
  reference ppAVar2;
  UdpPortListSyntax *pUVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  UdpPortListSyntax *in_R9;
  AttributeInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff88;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffb8;
  MemberSyntax *in_stack_ffffffffffffffc0;
  UdpPortListSyntax *local_38;
  UdpPortListSyntax *local_30;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_01 = (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
            &stack0x00000018;
  this_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&stack0x00000008;
  local_30 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,
             (SyntaxKind)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20),
             in_stack_ffffffffffffffb0);
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff88);
  in_RDI[6].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[6].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  *(pointer *)(in_RDI + 7) = this_01->_M_ptr;
  in_RDI[7].parent = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  local_38 = local_30;
  not_null<slang::syntax::UdpPortListSyntax_*>::not_null<slang::syntax::UdpPortListSyntax_*>
            ((not_null<slang::syntax::UdpPortListSyntax_*> *)&in_RDI[7].previewNode,&local_38);
  in_RDI[4].previewNode = in_RDI;
  std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffb8);
    ((*ppAVar2)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::AttributeInstanceSyntax_**,_std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffb8);
  }
  pUVar3 = not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                     ((not_null<slang::syntax::UdpPortListSyntax_*> *)0x50877a);
  (pUVar3->super_SyntaxNode).parent = in_RDI;
  return;
}

Assistant:

ExternUdpDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token externKeyword, const SyntaxList<AttributeInstanceSyntax>& actualAttributes, Token primitive, Token name, UdpPortListSyntax& portList) :
        MemberSyntax(SyntaxKind::ExternUdpDecl, attributes), externKeyword(externKeyword), actualAttributes(actualAttributes), primitive(primitive), name(name), portList(&portList) {
        this->actualAttributes.parent = this;
        for (auto child : this->actualAttributes)
            child->parent = this;
        this->portList->parent = this;
    }